

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::set_optional<unsigned_long>
          (Parser *this,string *name,string *alternative,unsigned_long defaultValue,
          string *description,bool dominant)

{
  CmdArgument<unsigned_long> *this_00;
  CmdArgument<unsigned_long> *local_58 [3];
  CmdArgument<unsigned_long> *local_40;
  CmdArgument<unsigned_long> *command;
  string *psStack_30;
  bool dominant_local;
  string *description_local;
  unsigned_long defaultValue_local;
  string *alternative_local;
  string *name_local;
  Parser *this_local;
  
  command._7_1_ = dominant;
  psStack_30 = description;
  description_local = (string *)defaultValue;
  defaultValue_local = (unsigned_long)alternative;
  alternative_local = name;
  name_local = &this->_appname;
  this_00 = (CmdArgument<unsigned_long> *)operator_new(0xb8);
  CmdArgument<unsigned_long>::CmdArgument
            (this_00,alternative_local,(string *)defaultValue_local,psStack_30,false,
             (bool)(command._7_1_ & 1));
  this_00->value = (unsigned_long)description_local;
  local_58[0] = this_00;
  local_40 = this_00;
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::push_back
            (&this->_commands,(value_type *)local_58);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "", bool dominant = false) {
			auto command = new CmdArgument<T> { name, alternative, description, false, dominant };
			command->value = defaultValue;
			_commands.push_back(command);
		}